

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O3

void luaL_unref(lua_State *L,int t,int ref)

{
  int iVar1;
  
  if (-1 < ref) {
    if (0xffffd8ef < t - 1U) {
      iVar1 = lua_gettop(L);
      t = t + iVar1 + 1;
    }
    lua_rawgeti(L,t,0);
    lua_rawseti(L,t,ref);
    lua_pushinteger(L,(ulong)(uint)ref);
    lua_rawseti(L,t,0);
    return;
  }
  return;
}

Assistant:

LUALIB_API void luaL_unref(lua_State *L, int t, int ref)
{
  if (ref >= 0) {
    t = abs_index(L, t);
    lua_rawgeti(L, t, FREELIST_REF);
    lua_rawseti(L, t, ref);  /* t[ref] = t[FREELIST_REF] */
    lua_pushinteger(L, ref);
    lua_rawseti(L, t, FREELIST_REF);  /* t[FREELIST_REF] = ref */
  }
}